

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

void smf_delete(smf_t *smf)

{
  guint gVar1;
  uint __line;
  char *__assertion;
  
  while( true ) {
    gVar1 = smf->tracks_array->len;
    if (gVar1 == 0) break;
    smf_track_delete((smf_track_t *)smf->tracks_array->pdata[gVar1 - 1]);
  }
  smf_fini_tempo(smf);
  if (smf->tracks_array->len == 0) {
    if (smf->number_of_tracks == 0) {
      g_ptr_array_free(smf->tracks_array,1);
      g_ptr_array_free(smf->tempo_array,1);
      free(smf);
      return;
    }
    __assertion = "smf->number_of_tracks == 0";
    __line = 0x5c;
  }
  else {
    __assertion = "smf->tracks_array->len == 0";
    __line = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,__line,"void smf_delete(smf_t *)");
}

Assistant:

void
smf_delete(smf_t *smf)
{
	/* Remove all the tracks, from last to first. */
	while (smf->tracks_array->len > 0)
		smf_track_delete(g_ptr_array_index(smf->tracks_array, smf->tracks_array->len - 1));

	smf_fini_tempo(smf);

	assert(smf->tracks_array->len == 0);
	assert(smf->number_of_tracks == 0);
	g_ptr_array_free(smf->tracks_array, TRUE);
	g_ptr_array_free(smf->tempo_array, TRUE);

	memset(smf, 0, sizeof(smf_t));
	free(smf);
}